

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O2

file_pool_entry * __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_pool_entry>::open_file_impl
          (file_pool_entry *__return_storage_ptr__,
          file_pool_impl<libtorrent::aux::file_pool_entry> *this,string *p,file_index_t file_index,
          file_storage *fs,open_mode_t m,file_id file_key)

{
  int64_t size;
  string_view name;
  string file_path;
  
  file_storage::file_path(&file_path,fs,file_index,p);
  size = file_storage::file_size(fs,file_index);
  name._M_str = file_path._M_dataplus._M_p;
  name._M_len = file_path._M_string_length;
  file_pool_entry::file_pool_entry(__return_storage_ptr__,file_key,name,m,size);
  ::std::__cxx11::string::~string((string *)&file_path);
  return __return_storage_ptr__;
}

Assistant:

FileEntry file_pool_impl<FileEntry>::open_file_impl(std::string const& p
		, file_index_t const file_index, file_storage const& fs
		, open_mode_t const m, file_id const file_key
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
		, std::shared_ptr<std::mutex> open_unmap_lock
#endif
		)
	{
		std::string const file_path = fs.file_path(file_index, p);
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
		std::unique_lock<std::mutex> lou(*open_unmap_lock);
#endif
		try
		{
			return FileEntry(file_key, file_path, m, fs.file_size(file_index)
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
				, open_unmap_lock
#endif
				);
		}
		catch (storage_error& se)
		{
			// opening the file failed. If it was because the directory was
			// missing, create it and try again. Otherwise, propagate the
			// error
			if (!(m & open_mode::write)
				|| (se.ec != boost::system::errc::no_such_file_or_directory
#ifdef TORRENT_WINDOWS
					// this is a workaround for improper handling of files on windows shared drives.
					// if the directory on a shared drive does not exist,
					// windows returns ERROR_IO_DEVICE instead of ERROR_FILE_NOT_FOUND
					&& se.ec != error_code(ERROR_IO_DEVICE, system_category())
#endif
				   ))
			{
				throw;
			}

			// create directory and try again
			// this means the directory the file is in doesn't exist.
			// so create it
			se.ec.clear();
			create_directories(parent_path(fs.file_path(file_index, p)), se.ec);

			if (se.ec)
			{
				// if the directory creation failed, don't try to open the file again
				// but actually just fail
				throw_ex<storage_error>(se);
			}

			return FileEntry(file_key, file_path, m, fs.file_size(file_index)
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
				, open_unmap_lock
#endif
				);
		}
	}